

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O0

void __thiscall
Commodore::C1540::SerialPortVIA::SerialPortVIA
          (SerialPortVIA *this,MOS6522<Commodore::C1540::SerialPortVIA> *via)

{
  MOS6522<Commodore::C1540::SerialPortVIA> *via_local;
  SerialPortVIA *this_local;
  
  MOS::MOS6522::IRQDelegatePortHandler::IRQDelegatePortHandler(&this->super_IRQDelegatePortHandler);
  this->via_ = via;
  this->port_b_ = '\0';
  std::weak_ptr<Commodore::Serial::Port>::weak_ptr(&this->serial_port_);
  this->attention_acknowledge_level_ = false;
  this->attention_level_input_ = true;
  this->data_level_output_ = false;
  return;
}

Assistant:

SerialPortVIA::SerialPortVIA(MOS::MOS6522::MOS6522<SerialPortVIA> &via) : via_(via) {}